

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakP-1600-opt64.c
# Opt level: O0

void KeccakP1600_ExtractAndAddBytes(void *state,uchar *input,uchar *output,uint offset,uint length)

{
  uint in_ECX;
  uchar *in_RDX;
  uchar *in_RSI;
  void *in_RDI;
  uint in_R8D;
  uint _bytesInLane;
  uchar *_curOutput;
  uchar *_curInput;
  uint _offsetInLane;
  uint _lanePosition;
  uint _sizeLeft;
  uint local_44;
  uchar *local_40;
  uchar *local_38;
  uint local_2c;
  uint local_28;
  uint local_24;
  
  if (in_ECX == 0) {
    KeccakP1600_ExtractAndAddLanes(in_RDI,in_RSI,in_RDX,in_R8D >> 3);
    KeccakP1600_ExtractAndAddBytesInLane
              (in_RDI,in_R8D >> 3,in_RSI + (in_R8D & 0xfffffff8),in_RDX + (in_R8D & 0xfffffff8),0,
               in_R8D & 7);
  }
  else {
    local_28 = in_ECX >> 3;
    local_2c = in_ECX & 7;
    local_40 = in_RDX;
    local_38 = in_RSI;
    for (local_24 = in_R8D; local_24 != 0; local_24 = local_24 - local_44) {
      local_44 = 8 - local_2c;
      if (local_24 < local_44) {
        local_44 = local_24;
      }
      KeccakP1600_ExtractAndAddBytesInLane(in_RDI,local_28,local_38,local_40,local_2c,local_44);
      local_28 = local_28 + 1;
      local_2c = 0;
      local_38 = local_38 + local_44;
      local_40 = local_40 + local_44;
    }
  }
  return;
}

Assistant:

void KeccakP1600_ExtractAndAddBytes(const void *state, const unsigned char *input, unsigned char *output, unsigned int offset, unsigned int length)
{
    SnP_ExtractAndAddBytes(state, input, output, offset, length, KeccakP1600_ExtractAndAddLanes, KeccakP1600_ExtractAndAddBytesInLane, 8);
}